

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  FILE *__stream;
  undefined8 extraout_RAX;
  string *this_00;
  stringstream local_208 [8];
  stringstream stream;
  ostream local_1f8 [112];
  ios_base local_188 [264];
  string local_80;
  undefined1 local_60 [8];
  FilePath output_file;
  FilePath output_dir;
  
  this_00 = &this->output_file_;
  FilePath::FilePath((FilePath *)local_60,this_00);
  FilePath::RemoveFileName
            ((FilePath *)((long)&output_file.pathname_.field_2 + 8),(FilePath *)local_60);
  bVar1 = FilePath::CreateDirectoriesRecursively
                    ((FilePath *)((long)&output_file.pathname_.field_2 + 8));
  if (bVar1) {
    __stream = fopen((this_00->_M_dataplus)._M_p,"w");
    if (__stream != (FILE *)0x0) {
      std::__cxx11::stringstream::stringstream(local_208);
      PrintXmlUnitTest(local_1f8,unit_test);
      StringStreamToString(&local_80,(stringstream *)local_208);
      fputs(local_80._M_dataplus._M_p,__stream);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      fclose(__stream);
      std::__cxx11::stringstream::~stringstream(local_208);
      std::ios_base::~ios_base(local_188);
      if ((size_type *)output_file.pathname_.field_2._8_8_ != &output_dir.pathname_._M_string_length
         ) {
        operator_delete((void *)output_file.pathname_.field_2._8_8_,
                        output_dir.pathname_._M_string_length + 1);
      }
      if (local_60 != (undefined1  [8])&output_file.pathname_._M_string_length) {
        operator_delete((void *)local_60,output_file.pathname_._M_string_length + 1);
      }
      return;
    }
  }
  OnTestIterationEnd((XmlUnitTestResultPrinter *)this_00);
  std::__cxx11::stringstream::~stringstream(local_208);
  std::ios_base::~ios_base(local_188);
  if ((size_type *)output_file.pathname_.field_2._8_8_ != &output_dir.pathname_._M_string_length) {
    operator_delete((void *)output_file.pathname_.field_2._8_8_,
                    output_dir.pathname_._M_string_length + 1);
  }
  if (local_60 != (undefined1  [8])&output_file.pathname_._M_string_length) {
    operator_delete((void *)local_60,output_file.pathname_._M_string_length + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    fprintf(stderr,
            "Unable to open file \"%s\"\n",
            output_file_.c_str());
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}